

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O0

void __thiscall
QMimeAllGlobPatterns::matchingGlobs
          (QMimeAllGlobPatterns *this,QString *fileName,QMimeGlobMatchResult *result,
          AddMatchFilterFunc *filterFunc)

{
  bool bVar1;
  undefined1 uVar2;
  ulong uVar3;
  qsizetype qVar4;
  const_iterator o;
  QMimeGlobMatchResult *pQVar5;
  QString *in_RDX;
  QString *in_RSI;
  long in_FS_OFFSET;
  QString *mime;
  QStringList *__range2;
  qsizetype ext_len;
  qsizetype lastDot;
  const_iterator __end2;
  const_iterator __begin2;
  QString simplePattern;
  QStringList matchingMimeTypes;
  QString simpleExtension;
  undefined4 in_stack_fffffffffffffe98;
  CaseSensitivity in_stack_fffffffffffffe9c;
  function<bool_(const_QString_&)> *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  QString *pattern;
  QString *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  QMimeGlobMatchResult *this_00;
  _Any_data *in_stack_ffffffffffffff00;
  QString *in_stack_ffffffffffffff08;
  QMimeGlobMatchResult *in_stack_ffffffffffffff10;
  QMimeGlobPatternList *in_stack_ffffffffffffff18;
  const_iterator local_a8;
  QLatin1StringView local_a0;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  _Any_data local_58;
  undefined1 *local_48;
  QString local_28;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QMimeGlobPatternList::match
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (AddMatchFilterFunc *)in_stack_ffffffffffffff00);
  QChar::QChar<char16_t,_true>(&local_a,L'.');
  uVar3 = QString::lastIndexOf
                    ((QString *)in_stack_fffffffffffffea0,
                     (QChar)(char16_t)((ulong)in_stack_fffffffffffffea8 >> 0x30),
                     in_stack_fffffffffffffe9c);
  if (uVar3 != 0xffffffffffffffff) {
    qVar4 = QString::size(in_RSI);
    in_stack_ffffffffffffff18 = (QMimeGlobPatternList *)(~uVar3 + qVar4);
    local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::right((QString *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                   (qsizetype)in_stack_fffffffffffffeb0);
    QString::toLower((QString *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    QString::~QString((QString *)0x8eea41);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._M_unused._M_object = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QHash<QString,_QList<QString>_>::value
              ((QHash<QString,_QList<QString>_> *)
               CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
               in_stack_fffffffffffffeb0);
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_a0 = Qt::Literals::StringLiterals::operator____L1
                         (in_stack_fffffffffffffea8,(size_t)in_stack_fffffffffffffea0);
    ::operator+((QLatin1String *)in_stack_fffffffffffffea0,
                (QString *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QLatin1String,_const_QString_&> *)
               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    in_stack_ffffffffffffff00 = &local_58;
    local_a8.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8 = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffea0);
    o = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffea0);
    while (bVar1 = QList<QString>::const_iterator::operator!=(&local_a8,o), bVar1) {
      pQVar5 = (QMimeGlobMatchResult *)QList<QString>::const_iterator::operator*(&local_a8);
      this_00 = pQVar5;
      uVar2 = std::function<bool_(const_QString_&)>::operator()
                        (in_stack_fffffffffffffea0,
                         (QString *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      if ((bool)uVar2) {
        pattern = in_RDX;
        QString::size(&local_28);
        QMimeGlobMatchResult::addMatch
                  (this_00,(QString *)CONCAT17(uVar2,in_stack_fffffffffffffeb8),
                   (int)((ulong)pQVar5 >> 0x20),pattern,(qsizetype)in_stack_fffffffffffffea0);
      }
      QList<QString>::const_iterator::operator++(&local_a8);
    }
    QString::~QString((QString *)0x8eeca7);
    QList<QString>::~QList((QList<QString> *)0x8eecb4);
    QString::~QString((QString *)0x8eecc1);
  }
  QMimeGlobPatternList::match
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (AddMatchFilterFunc *)in_stack_ffffffffffffff00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMimeAllGlobPatterns::matchingGlobs(const QString &fileName, QMimeGlobMatchResult &result,
                                         const AddMatchFilterFunc &filterFunc) const
{
    // First try the high weight matches (>50), if any.
    m_highWeightGlobs.match(result, fileName, filterFunc);

    // Now use the "fast patterns" dict, for simple *.foo patterns with weight 50
    // (which is most of them, so this optimization is definitely worth it)
    const qsizetype lastDot = fileName.lastIndexOf(u'.');
    if (lastDot != -1) { // if no '.', skip the extension lookup
        const qsizetype ext_len = fileName.size() - lastDot - 1;
        const QString simpleExtension = fileName.right(ext_len).toLower();
        // (toLower because fast patterns are always case-insensitive and saved as lowercase)

        const QStringList matchingMimeTypes = m_fastPatterns.value(simpleExtension);
        const QString simplePattern = "*."_L1 + simpleExtension;
        for (const QString &mime : matchingMimeTypes) {
            if (filterFunc(mime)) {
                result.addMatch(mime, 50, simplePattern, simpleExtension.size());
            }
        }
        // Can't return yet; *.tar.bz2 has to win over *.bz2, so we need the low-weight mimetypes anyway,
        // at least those with weight 50.
    }

    // Finally, try the low weight matches (<=50)
    m_lowWeightGlobs.match(result, fileName, filterFunc);
}